

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_965631::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody
          (RSATest_DISABLED_BlindingCacheConcurrency_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  allocator_type *paVar3;
  undefined1 auVar4 [8];
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_a232c0a2_for__M_head_impl *__args;
  thread *thread;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined1 auVar7 [8];
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  char *in_R9;
  ulong __n;
  long lVar8;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_16_2_a232c0a2_for__M_head_impl worker;
  UniquePtr<RSA> rsa;
  uint8_t kDummyHash [32];
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  allocator_type *local_88;
  thread local_78;
  string *local_70;
  AssertHelper local_68;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_60;
  string local_58;
  
  local_60._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes((uint8_t *)&(anonymous_namespace)::kKey1,0x260);
  local_98[0] = (tuple<rsa_st_*,_bssl::internal::Deleter>)
                local_60._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_rsa_st_*,_false>)0x0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      local_60._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)local_98,(AssertionResult *)0x5a8385,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x5c9,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_id._M_thread != 0) {
      (**(code **)((long)*(__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true> *)
                          local_78._M_id._M_thread + 8))();
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
  }
  else {
    local_78._M_id._M_thread = (id)&local_60;
    local_70 = &local_58;
    local_58.field_2._M_allocated_capacity = 0;
    local_58.field_2._8_8_ = 0;
    local_58._M_dataplus._M_p = (char *)0x0;
    local_58._M_string_length = 0;
    local_98 = (undefined1  [8])0x0;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = (allocator_type *)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_98,0x800);
    lVar8 = 0;
    __args = extraout_RDX;
    do {
      pbVar1 = pbStack_90;
      auVar7 = local_98;
      if (pbStack_90 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
        if ((long)pbStack_90 - (long)local_98 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar5 = (long)pbStack_90 - (long)local_98 >> 3;
        uVar2 = uVar5 + (uVar5 == 0);
        __n = uVar2 + uVar5;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar2,uVar5)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          paVar3 = (allocator_type *)0x0;
        }
        else {
          paVar3 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)local_98,__n,(void *)0x0);
          __args = extraout_RDX_01;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  (paVar3 + uVar5 * 8,&local_78,__args);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3;
        for (auVar4 = auVar7; auVar4 != (undefined1  [8])pbVar1;
            auVar4 = (undefined1  [8])((long)auVar4 + 8)) {
          ((id *)&((allocator_type *)pbVar6)->field_0x0)->_M_thread =
               ((id *)&((allocator_type *)auVar4)->field_0x0)->_M_thread;
          ((id *)&((allocator_type *)auVar4)->field_0x0)->_M_thread = 0;
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pbVar6 + 8);
        }
        __args = extraout_RDX_02;
        if (auVar7 != (undefined1  [8])0x0) {
          operator_delete((void *)auVar7,(long)local_88 - (long)auVar7);
          __args = extraout_RDX_03;
        }
        local_88 = paVar3 + __n * 8;
        local_98 = (undefined1  [8])paVar3;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  ((allocator_type *)pbStack_90,&local_78,__args);
        __args = extraout_RDX_00;
        pbVar6 = pbStack_90;
      }
      paVar3 = (allocator_type *)((long)pbVar6 + 8);
      lVar8 = lVar8 + 1;
      auVar7 = local_98;
      pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3;
    } while (lVar8 != 0x800);
    for (; auVar7 != (undefined1  [8])paVar3; auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_98);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
  return;
}

Assistant:

TEST(RSATest, DISABLED_BlindingCacheConcurrency) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);

#if defined(OPENSSL_TSAN)
  constexpr size_t kSignaturesPerThread = 10;
  constexpr size_t kNumThreads = 10;
#else
  constexpr size_t kSignaturesPerThread = 100;
  constexpr size_t kNumThreads = 2048;
#endif

  const uint8_t kDummyHash[32] = {0};
  auto worker = [&] {
    std::vector<uint8_t> sig(RSA_size(rsa.get()));
    for (size_t i = 0; i < kSignaturesPerThread; i++) {
      unsigned sig_len = sig.size();
      EXPECT_TRUE(RSA_sign(NID_sha256, kDummyHash, sizeof(kDummyHash),
                           sig.data(), &sig_len, rsa.get()));
    }
  };

  std::vector<std::thread> threads;
  threads.reserve(kNumThreads);
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back(worker);
  }
  for (auto &thread : threads) {
    thread.join();
  }
}